

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestAddUInt64(void)

{
  Bignum bignum;
  char buffer [1024];
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  Bignum *in_stack_fffffffffffff9f0;
  Chunk in_stack_fffffffffffff9f8;
  undefined2 in_stack_fffffffffffff9fc;
  uint16_t in_stack_fffffffffffff9fe;
  Bignum *in_stack_fffffffffffffa00;
  Chunk in_stack_fffffffffffffa08;
  Chunk in_stack_fffffffffffffa0c;
  Bignum *in_stack_fffffffffffffa10;
  Chunk in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  Bignum *in_stack_fffffffffffffa28;
  uint64_t in_stack_fffffffffffffbf8;
  Bignum *in_stack_fffffffffffffc00;
  
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff9f4);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::AddUInt64(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  return;
}

Assistant:

TEST(AddUInt64) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("B", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("101", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000000000000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000001", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "0");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x100, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFF00000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000000FFFF00000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000FFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000100000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000FFFF00000000", buffer);
}